

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

uint32_t load4(uchar *in)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = (uint)in[3];
  lVar2 = 3;
  do {
    uVar1 = (uint)in[lVar2 + -1] | uVar1 << 8;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return uVar1;
}

Assistant:

uint32_t load4(const unsigned char * in)
{
	int i;
	uint32_t ret = in[3];

	for (i = 2; i >= 0; i--)
	{
		ret <<= 8;
		ret |= in[i];
	}

	return ret;
}